

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O2

void xlfparser::_infer_token_subtypes<wchar_t>
               (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens,
               Options<wchar_t> *options,wchar_t *formula,size_t size)

{
  ulong uVar1;
  bool bVar2;
  wostream *pwVar3;
  undefined8 uVar4;
  out_of_range *this;
  wchar_t wVar5;
  pointer pTVar6;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> bStack_1f8;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> number_re;
  basic_stringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> number_re_ss;
  wostream local_1a8 [376];
  
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&number_re_ss);
  pwVar3 = std::operator<<(local_1a8,"^\\d+(\\");
  if ((options->decimal_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged == false) {
    wVar5 = L'.';
  }
  else {
    wVar5 = (options->decimal_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
            super__Optional_payload_base<wchar_t>._M_payload._M_value;
  }
  pwVar3 = std::operator<<(pwVar3,wVar5);
  std::operator<<(pwVar3,"\\d+)?(E[+-]\\d+)?$");
  std::__cxx11::wstringbuf::str();
  std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
  basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&number_re,&bStack_1f8,0x11
            );
  std::__cxx11::wstring::~wstring((wstring *)&bStack_1f8);
  pTVar6 = (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl
           .super__Vector_impl_data._M_start;
  do {
    if (pTVar6 == (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
                (&number_re);
      std::__cxx11::wstringstream::~wstringstream((wstringstream *)&number_re_ss);
      return;
    }
    uVar1 = pTVar6->m_start;
    if ((size <= uVar1) || (size <= pTVar6->m_end)) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"Token index out of range");
      __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if (pTVar6->m_type == Operand) {
      if (pTVar6->m_subtype == None) {
        bVar2 = std::regex_match<wchar_t_const*,wchar_t,std::__cxx11::regex_traits<wchar_t>>
                          (formula + uVar1,formula + pTVar6->m_end + 1,&number_re,0);
        if (bVar2) {
          pTVar6->m_subtype = Number;
        }
        else {
          pTVar6->m_subtype = Range;
        }
      }
    }
    else if (pTVar6->m_type == OperatorInfix) {
      wVar5 = formula[uVar1];
      if (wVar5 == L'+') {
LAB_0016114f:
        if ((tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
            _M_impl.super__Vector_impl_data._M_start < pTVar6) {
          switch(pTVar6[-1].m_type) {
          case Function:
          case Subexpression:
            if (pTVar6[-1].m_subtype != Stop) goto switchD_00161166_caseD_3;
          case Operand:
          case OperatorPostfix:
switchD_00161166_caseD_1:
            pTVar6->m_subtype = Math;
            break;
          default:
            goto switchD_00161166_caseD_3;
          }
          goto LAB_001611f5;
        }
switchD_00161166_caseD_3:
        uVar4 = 0x800000007;
      }
      else {
        if (wVar5 != L'@') {
          if (wVar5 == L'-') goto LAB_0016114f;
          if (pTVar6->m_subtype == None) {
            if ((uint)(wVar5 + L'\xffffffc4') < 3) {
              pTVar6->m_subtype = Logical;
            }
            else {
              if (wVar5 != L'&') goto switchD_00161166_caseD_1;
              pTVar6->m_subtype = Concatenation;
            }
          }
          goto LAB_001611f5;
        }
        uVar4 = 0xa00000007;
      }
      pTVar6->m_type = (int)uVar4;
      pTVar6->m_subtype = (int)((ulong)uVar4 >> 0x20);
    }
LAB_001611f5:
    pTVar6 = pTVar6 + 1;
  } while( true );
}

Assistant:

inline void _infer_token_subtypes(std::vector<Token>& tokens,
                                      const Options<char_type>& options,
                                      const char_type* formula,
                                      size_t size)
    {
        std::basic_stringstream<char_type> number_re_ss;
        number_re_ss << R"(^\d+(\)" << options.decimal_separator.value_or(XLFP_CHAR('.')) << R"(\d+)?(E[+-]\d+)?$)";
        const std::basic_regex<char_type> number_re(number_re_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        for (auto iter = tokens.begin(); iter != tokens.end(); ++iter)
        {
            auto& token = *iter;

            if (token.start() >= size || token.end() >= size)
                throw std::out_of_range("Token index out of range");

            if (token.type() == Token::Type::OperatorInfix && (
                    formula[token.start()] == XLFP_CHAR('-') ||
                    formula[token.start()] == XLFP_CHAR('+')))
            {
                // If the previous token was function, expression, postfix operator or operand, this token
                // is an infix operator of subtype math.
                if (iter > tokens.begin())
                {
                    auto& previous = *(iter-1);
                    if ((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::OperatorPostfix) ||
                        (previous.type() == Token::Type::Operand))
                    {
                        token.subtype(Token::Subtype::Math);
                        continue;
                    }
                }

                // Otherwise assume it's a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Math);
                continue;
            }

            if (token.type() == Token::Type::OperatorInfix && formula[token.start()] == XLFP_CHAR('+'))
            {
                // If the previous token  was function, expression, postfix operator or operand, this token
                // is an infix operator of subtype math.
                if (iter > tokens.begin())
                {
                    auto& previous = *(iter-1);
                    if ((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::OperatorPostfix) ||
                        (previous.type() == Token::Type::Operand))
                    {
                        token.subtype(Token::Subtype::Math);
                        continue;
                    }
                }

                // Otherwise assume it's a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Math);
                continue;
            }

            if (token.type() == Token::Type::OperatorInfix && formula[token.start()] == XLFP_CHAR('@'))
            {
                // Implicit intersection operator is always a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Intersection);
            }

            if (token.type() == Token::Type::OperatorInfix && token.subtype() == Token::Subtype::None)
            {
                if (formula[token.start()] == XLFP_CHAR('<') ||
                    formula[token.start()] == XLFP_CHAR('>') ||
                    formula[token.start()] == XLFP_CHAR('='))
                {
                    token.subtype(Token::Subtype::Logical);
                }
                else if (formula[token.start()] == XLFP_CHAR('&'))
                {
                    token.subtype(Token::Subtype::Concatenation);
                }
                else
                {
                    token.subtype(Token::Subtype::Math);
                }

                continue;
            }

            // Set the operand type to Number or Range
            if (token.type() == Token::Type::Operand && token.subtype() == Token::Subtype::None)
            {
                if (std::regex_match(&formula[token.start()], &formula[token.end()]+1, number_re))
                {
                    token.subtype(Token::Subtype::Number);
                }
                else
                {
                    token.subtype(Token::Subtype::Range);
                }
            }
        }
    }